

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

int minTemp1_fast_moreThen5(word *pInOut,int iVar,int nWords,int *pDifStart)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  bVar1 = (byte)(iVar + -6);
  uVar5 = 1 << (bVar1 & 0x1f);
  iVar4 = 1;
  uVar6 = (-2 << (bVar1 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar1 & 0x1f)) + nWords;
  if ((int)uVar6 < 0) {
    iVar2 = 0;
  }
  else {
    uVar3 = 1;
    if (1 < (int)uVar5) {
      uVar3 = (ulong)uVar5;
    }
    do {
      if (iVar + -6 != 0x1f) {
        lVar7 = 0;
        do {
          iVar4 = -(uint)(pInOut[(ulong)uVar6 + lVar7] <
                         pInOut[((ulong)uVar6 + lVar7) - (long)(int)uVar5]);
          if (pInOut[((ulong)uVar6 + lVar7) - (long)(int)uVar5] < pInOut[(ulong)uVar6 + lVar7]) {
            iVar4 = 1;
          }
          if (iVar4 != 0) {
            iVar2 = uVar5 + uVar6 + 1;
            if (iVar4 == -1) goto LAB_005e9cc8;
            iVar4 = 2;
            goto LAB_005e9ce2;
          }
          lVar7 = lVar7 + -1;
        } while (-lVar7 != uVar3);
      }
      uVar6 = uVar6 + (-4 << (bVar1 & 0x1f));
    } while (-1 < (int)uVar6);
    iVar2 = 0;
LAB_005e9cc8:
    iVar4 = 1;
  }
LAB_005e9ce2:
  *pDifStart = iVar2;
  return iVar4;
}

Assistant:

int minTemp1_fast_moreThen5(word* pInOut, int iVar, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp1_fast_moreThen5\n");

    for(i=nWords - wordBlock - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j],pInOut[i-j-wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+wordBlock+1;
                return 1;
            }
            else
            {
                *pDifStart = i+wordBlock+1;
                return 2;
            }
        }
    *pDifStart=0;
//    printf("out minTemp1_fast_moreThen5\n");

    return 1;
}